

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar6;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar7;
  bool bVar8;
  uint uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  value_type vVar13;
  value_type vVar14;
  
  pFVar2 = (fadexpr->fadexpr_).left_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar11 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar11 < (int)uVar1) {
    uVar11 = uVar1;
  }
  pFVar3 = (pFVar2->fadexpr_).right_;
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar9 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar9 < (int)uVar1) {
    uVar9 = uVar1;
  }
  pFVar3 = (fadexpr->fadexpr_).right_;
  if ((int)uVar9 < (int)uVar11) {
    uVar9 = uVar11;
  }
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar11 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar11 < (int)uVar1) {
    uVar11 = uVar1;
  }
  if ((int)uVar11 < (int)uVar9) {
    uVar11 = uVar9;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar11 != uVar1) {
    if (uVar11 == 0) {
      if (uVar1 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar11;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar11) {
        uVar12 = (long)(int)uVar11 << 3;
      }
      pdVar10 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar10;
    }
  }
  if (uVar11 != 0) {
    pdVar10 = (this->dx_).ptr_to_data;
    bVar8 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
            ::hasFastAccess(&fadexpr->fadexpr_);
    if (bVar8) {
      if (0 < (int)uVar11) {
        uVar12 = 0;
        do {
          vVar13 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                   ::fastAccessDx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar12);
          pFVar3 = (fadexpr->fadexpr_).right_;
          pFVar4 = (pFVar3->fadexpr_).left_;
          pFVar5 = (pFVar3->fadexpr_).right_;
          pdVar10[uVar12] =
               (pFVar4->dx_).ptr_to_data[uVar12] * pFVar5->val_ +
               (pFVar5->dx_).ptr_to_data[uVar12] * pFVar4->val_ + vVar13;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    else if (0 < (int)uVar11) {
      uVar12 = 0;
      do {
        vVar14 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar12);
        pdVar10[uVar12] = vVar14;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  pFVar2 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar6 = (pFVar2->fadexpr_).left_;
  pFVar7 = (pFVar2->fadexpr_).right_;
  this->val_ = ((pFVar3->fadexpr_).left_)->val_ * ((pFVar3->fadexpr_).right_)->val_ +
               ((pFVar7->fadexpr_).left_)->val_ * ((pFVar7->fadexpr_).right_)->val_ +
               ((pFVar6->fadexpr_).left_)->val_ * ((pFVar6->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}